

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O3

void empty_closedir_cb(uv_fs_t *req)

{
  int iVar1;
  
  if (req == &closedir_req) {
    if (closedir_req.fs_type == UV_FS_CLOSEDIR) {
      if (closedir_req.result == 0) {
        empty_closedir_cb_count = empty_closedir_cb_count + 1;
        uv_fs_req_cleanup(&closedir_req);
        return;
      }
      goto LAB_0015afdd;
    }
  }
  else {
    empty_closedir_cb_cold_1();
  }
  empty_closedir_cb_cold_2();
LAB_0015afdd:
  empty_closedir_cb_cold_3();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(req,0);
  return;
}

Assistant:

static void empty_closedir_cb(uv_fs_t* req) {
  ASSERT(req == &closedir_req);
  ASSERT(req->fs_type == UV_FS_CLOSEDIR);
  ASSERT(req->result == 0);
  ++empty_closedir_cb_count;
  uv_fs_req_cleanup(req);
}